

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_preserve_unknown_enum.pb.cc
# Opt level: O0

size_t __thiscall proto3_preserve_unknown_enum_unittest::MyMessage::ByteSizeLong(MyMessage *this)

{
  MyEnum MVar1;
  OCase OVar2;
  RepeatedField<int> *pRVar3;
  size_t sVar4;
  size_t sVar5;
  uint32_t *puVar6;
  size_t sStack_58;
  uint32_t cached_has_bits;
  size_t total_size;
  MyMessage *this_;
  MyMessage *this_local;
  ulong local_38;
  size_t line;
  void *prefetch_ptr;
  ptrdiff_t offset;
  
  for (local_38 = 0; local_38 < 5; local_38 = local_38 + 1) {
  }
  pRVar3 = _internal_repeated_e(this);
  sVar4 = google::protobuf::internal::WireFormatLite::EnumSizeWithPackedTagSize
                    (pRVar3,1,&(this->field_0)._impl_._repeated_e_cached_byte_size_);
  pRVar3 = _internal_repeated_packed_e(this);
  sVar5 = google::protobuf::internal::WireFormatLite::EnumSizeWithPackedTagSize
                    (pRVar3,1,&(this->field_0)._impl_._repeated_packed_e_cached_byte_size_);
  pRVar3 = _internal_repeated_packed_unexpected_e(this);
  sStack_58 = google::protobuf::internal::WireFormatLite::EnumSizeWithPackedTagSize
                        (pRVar3,1,&(this->field_0)._impl_.
                                   _repeated_packed_unexpected_e_cached_byte_size_);
  sStack_58 = sStack_58 + sVar5 + sVar4;
  puVar6 = google::protobuf::internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  if (((*puVar6 & 1) != 0) && (MVar1 = _internal_e(this), MVar1 != FOO)) {
    MVar1 = _internal_e(this);
    sVar4 = google::protobuf::internal::WireFormatLite::EnumSize(MVar1);
    sStack_58 = sVar4 + 1 + sStack_58;
  }
  OVar2 = o_case(this);
  if (OVar2 != O_NOT_SET) {
    if (OVar2 == kOneofE1) {
      MVar1 = _internal_oneof_e_1(this);
      sVar4 = google::protobuf::internal::WireFormatLite::EnumSize(MVar1);
      sStack_58 = sVar4 + 1 + sStack_58;
    }
    else if (OVar2 == kOneofE2) {
      MVar1 = _internal_oneof_e_2(this);
      sVar4 = google::protobuf::internal::WireFormatLite::EnumSize(MVar1);
      sStack_58 = sVar4 + 1 + sStack_58;
    }
  }
  sVar4 = google::protobuf::Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sStack_58,&(this->field_0)._impl_._cached_size_);
  return sVar4;
}

Assistant:

::size_t MyMessage::ByteSizeLong() const {
  const MyMessage& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:proto3_preserve_unknown_enum_unittest.MyMessage)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
   {
    // repeated .proto3_preserve_unknown_enum_unittest.MyEnum repeated_e = 2;
    {
      total_size += ::_pbi::WireFormatLite::EnumSizeWithPackedTagSize(
          this_._internal_repeated_e(), 1, this_._impl_._repeated_e_cached_byte_size_);
    }
    // repeated .proto3_preserve_unknown_enum_unittest.MyEnum repeated_packed_e = 3;
    {
      total_size += ::_pbi::WireFormatLite::EnumSizeWithPackedTagSize(
          this_._internal_repeated_packed_e(), 1, this_._impl_._repeated_packed_e_cached_byte_size_);
    }
    // repeated .proto3_preserve_unknown_enum_unittest.MyEnumPlusExtra repeated_packed_unexpected_e = 4;
    {
      total_size += ::_pbi::WireFormatLite::EnumSizeWithPackedTagSize(
          this_._internal_repeated_packed_unexpected_e(), 1, this_._impl_._repeated_packed_unexpected_e_cached_byte_size_);
    }
  }
   {
    // .proto3_preserve_unknown_enum_unittest.MyEnum e = 1;
    cached_has_bits = this_._impl_._has_bits_[0];
    if ((cached_has_bits & 0x00000001u) != 0) {
      if (this_._internal_e() != 0) {
        total_size += 1 +
                      ::_pbi::WireFormatLite::EnumSize(this_._internal_e());
      }
    }
  }
  switch (this_.o_case()) {
    // .proto3_preserve_unknown_enum_unittest.MyEnum oneof_e_1 = 5;
    case kOneofE1: {
      total_size += 1 +
                    ::_pbi::WireFormatLite::EnumSize(this_._internal_oneof_e_1());
      break;
    }
    // .proto3_preserve_unknown_enum_unittest.MyEnum oneof_e_2 = 6;
    case kOneofE2: {
      total_size += 1 +
                    ::_pbi::WireFormatLite::EnumSize(this_._internal_oneof_e_2());
      break;
    }
    case O_NOT_SET: {
      break;
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}